

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QHttp2Stream*,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>::
emplace_helper<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>const&>
          (QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *this,
          QHttp2Stream **key,pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *args)

{
  long lVar1;
  piter it;
  piter pVar2;
  iterator<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
  *in_RDX;
  Data<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
  *in_RSI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff88;
  Data<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
  *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::
  Data<QHashPrivate::Node<QHttp2Stream*,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>>::
  findOrInsert<QHttp2Stream*>(in_RSI,(QHttp2Stream **)in_RDX);
  QHashPrivate::
  iterator<QHashPrivate::Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>
  ::node(in_RDX);
  QHashPrivate::Node<QHttp2Stream*,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>::
  createInPlace<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>const&>
            ((Node<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
             in_stack_ffffffffffffff90,(QHttp2Stream **)in_stack_ffffffffffffff88,
             (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)0x2e2023);
  it.bucket = in_stack_ffffffffffffff98;
  it.d = in_stack_ffffffffffffff90;
  QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::iterator::iterator
            (in_stack_ffffffffffffff88,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }